

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::OP_SetProperty
               (Var instance,PropertyId propertyId,Var newValue,ScriptContext *scriptContext,
               PropertyValueInfo *info,PropertyOperationFlags flags,Var thisInstance)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  PropertyRecord *pPVar6;
  RecyclableObject *pRVar7;
  RecyclableObject *object;
  char *message;
  char *error;
  uint lineNumber;
  char *fileName;
  
  if (thisInstance == (Var)0x0) {
    thisInstance = instance;
  }
  if (instance == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00aaba14;
    *puVar5 = 0;
LAB_00aab888:
    pRVar7 = UnsafeVarTo<Js::RecyclableObject>(instance);
    if (pRVar7 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00aaba14;
      *puVar5 = 0;
    }
    TVar1 = ((pRVar7->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if ((int)TVar1 < 2) {
        bVar3 = ThreadContext::RecordImplicitException(scriptContext->threadContext);
        if (!bVar3) {
          return 1;
        }
        pPVar6 = ScriptContext::GetPropertyName(scriptContext,propertyId);
        JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec49,(PCWSTR)(pPVar6 + 1));
      }
      goto LAB_00aab9a3;
    }
    BVar4 = RecyclableObject::IsExternal(pRVar7);
    if (BVar4 != 0) goto LAB_00aab9a3;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
    ;
    error = "(typeId < TypeIds_Limit || obj->IsExternal())";
    message = "GetTypeId aValue has invalid TypeId";
    lineNumber = 0xe;
  }
  else {
    if (((ulong)instance & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)instance & 0xffff000000000000) != 0x1000000000000) {
      if ((ulong)instance >> 0x32 != 0 || ((ulong)instance & 0xffff000000000000) == 0x1000000000000)
      goto LAB_00aab9a3;
      goto LAB_00aab888;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
    ;
    error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    lineNumber = 0x2a;
  }
  bVar3 = Throw::ReportAssert(fileName,lineNumber,error,message);
  if (!bVar3) {
LAB_00aaba14:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar5 = 0;
LAB_00aab9a3:
  bVar3 = VarIs<Js::RecyclableObject>(instance);
  if ((bVar3) && (bVar3 = VarIs<Js::RecyclableObject>(thisInstance), bVar3)) {
    pRVar7 = UnsafeVarTo<Js::RecyclableObject>(thisInstance);
    object = UnsafeVarTo<Js::RecyclableObject>(instance);
    BVar4 = SetProperty_Internal<false>
                      (pRVar7,object,false,propertyId,newValue,info,scriptContext,flags);
  }
  else {
    JavascriptError::ThrowCantAssignIfStrictMode(flags,scriptContext);
    BVar4 = 0;
  }
  return BVar4;
}

Assistant:

BOOL JavascriptOperators::OP_SetProperty(Var instance, PropertyId propertyId, Var newValue, ScriptContext* scriptContext, PropertyValueInfo * info, PropertyOperationFlags flags, Var thisInstance)
    {
        // The call into ToObject(dynamicObject) is avoided here by checking for null and undefined and doing nothing when dynamicObject is a primitive value.
        if (thisInstance == nullptr)
        {
            thisInstance = instance;
        }
        TypeId typeId = JavascriptOperators::GetTypeId(instance);

        if (JavascriptOperators::IsUndefinedOrNullType(typeId))
        {
            if (scriptContext->GetThreadContext()->RecordImplicitException())
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_CannotSet_NullOrUndefined, scriptContext->GetPropertyName(propertyId)->GetBuffer());
            }
            return TRUE;
        }

        if (!TaggedNumber::Is(instance) && !TaggedNumber::Is(thisInstance))
        {
            return JavascriptOperators::SetProperty(UnsafeVarTo<RecyclableObject>(thisInstance), UnsafeVarTo<RecyclableObject>(instance), propertyId, newValue, info, scriptContext, flags);
        }

        JavascriptError::ThrowCantAssignIfStrictMode(flags, scriptContext);
        return false;
    }